

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O3

int osfdel_temp(char *fname)

{
  int iVar1;
  
  if (*fname != '\0') {
    iVar1 = remove(fname);
    return (uint)(iVar1 != 0);
  }
  return 0;
}

Assistant:

int
osfdel_temp( const char* fname )
{
    //ASSERT(fname != 0);

    if (fname[0] == '\0' or remove(fname) == 0) {
        // Either it was a nameless temp-file and has been
        // already deleted by the system, or deleting it
        // succeeded.  In either case, the operation was
        // successful.
        return 0;
    }
    // It was not a nameless tempfile and remove() failed.
    return 1;
}